

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::detach_shader(NegativeTestContext *ctx)

{
  GLuint shader;
  GLuint program;
  GLuint shader_00;
  GLuint program_00;
  allocator<char> local_49;
  string local_48;
  
  shader = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  program = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  shader_00 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  program_00 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shader_00);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "GL_INVALID_VALUE is generated if either program or shader is not a value generated by OpenGL."
             ,&local_49);
  NegativeTestContext::beginSection(ctx,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  glu::CallLogWrapper::glDetachShader(&ctx->super_CallLogWrapper,program_00,shader);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glDetachShader(&ctx->super_CallLogWrapper,program,shader_00);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glDetachShader(&ctx->super_CallLogWrapper,program_00,shader_00);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "GL_INVALID_OPERATION is generated if program is not a program object.",&local_49);
  NegativeTestContext::beginSection(ctx,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  glu::CallLogWrapper::glDetachShader(&ctx->super_CallLogWrapper,shader,shader);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "GL_INVALID_OPERATION is generated if shader is not a shader object.",&local_49);
  NegativeTestContext::beginSection(ctx,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  glu::CallLogWrapper::glDetachShader(&ctx->super_CallLogWrapper,program,program);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glDetachShader(&ctx->super_CallLogWrapper,shader,program);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "GL_INVALID_OPERATION is generated if shader is not attached to program.",&local_49);
  NegativeTestContext::beginSection(ctx,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  glu::CallLogWrapper::glDetachShader(&ctx->super_CallLogWrapper,program,shader);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shader);
  return;
}

Assistant:

void detach_shader (NegativeTestContext& ctx)
{
	GLuint shader = ctx.glCreateShader(GL_VERTEX_SHADER);
	GLuint program = ctx.glCreateProgram();

	const GLuint notAShader = ctx.glCreateShader(GL_VERTEX_SHADER);
	const GLuint notAProgram = ctx.glCreateProgram();

	ctx.glDeleteShader(notAShader);
	ctx.glDeleteProgram(notAProgram);

	ctx.beginSection("GL_INVALID_VALUE is generated if either program or shader is not a value generated by OpenGL.");
	ctx.glDetachShader(notAProgram, shader);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glDetachShader(program, notAShader);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glDetachShader(notAProgram, notAShader);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glDetachShader(shader, shader);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if shader is not a shader object.");
	ctx.glDetachShader(program, program);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glDetachShader(shader, program);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if shader is not attached to program.");
	ctx.glDetachShader(program, shader);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteProgram(program);
	ctx.glDeleteShader(shader);
}